

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

int pg::mark_solved_rec_CALL(WorkerP *w,Task *__dq_head,PSISolver *arg_1,int arg_2,int arg_3)

{
  int iVar1;
  int arg_3_local;
  int arg_2_local;
  PSISolver *arg_1_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  int res_1;
  int n;
  int i;
  int res;
  int local_c;
  
  if (arg_3 < 0x40) {
    n = 0;
    for (res_1 = 0; res_1 < arg_3; res_1 = res_1 + 1) {
      iVar1 = arg_2 + res_1;
      if (*(int *)(done + (long)iVar1 * 4) == 2) {
        *(undefined4 *)(won + (long)iVar1 * 4) = 1;
        *(undefined4 *)(done + (long)iVar1 * 4) = 3;
        n = n + 1;
      }
    }
    local_c = n;
  }
  else {
    mark_solved_rec_SPAWN(w,__dq_head,arg_1,arg_2 + arg_3 / 2,arg_3 - arg_3 / 2);
    local_c = mark_solved_rec_CALL(w,__dq_head + 1,arg_1,arg_2,arg_3 / 2);
    iVar1 = mark_solved_rec_SYNC(w,__dq_head);
    local_c = local_c + iVar1;
  }
  return local_c;
}

Assistant:

TASK_3(int, mark_solved_rec, PSISolver*, s, int, begin, int, count)
{
    // some cut-off point...
    if (count < 64) {
        int res = 0;
        for (int i=0; i<count; i++) {
            int n = begin+i;
            if (done[n] == 2) { // done[n] == 3 proxies disabled and won
                won[n] = 1;
                done[n] = 3; // mark as won
                res++;
            }
        }
        return res;
    } else {
        SPAWN(mark_solved_rec, s, begin+count/2, count-count/2);
        int res = CALL(mark_solved_rec, s, begin, count/2);
        return res + SYNC(mark_solved_rec);
    }
}